

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

int mctools_is_dir(mcu8str *rawpath)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  mcu8str path;
  mcu8str s_1;
  stat sinfo;
  char buf [4096];
  mcu8str local_10e8;
  mcu8str local_10d0;
  stat local_10b8;
  char local_1028 [4096];
  
  pcVar2 = rawpath->c_str;
  uVar1 = rawpath->size;
  local_10e8.buflen = uVar1 + 1;
  local_10e8.owns_memory = 0;
  local_10e8.c_str = pcVar2;
  local_10e8.size = uVar1;
  iVar3 = mctools_impl_has_winnamespace(rawpath);
  if (iVar3 != 0) {
    local_10e8.c_str = pcVar2 + 4;
    local_10e8.size = uVar1 - 4;
  }
  local_10d0.owns_memory = 0;
  local_10d0.c_str = local_1028;
  local_1028[0] = '\0';
  local_10d0.size = 0;
  local_10d0.buflen = 0x1000;
  mcu8str_assign(&local_10d0,&local_10e8);
  mctools_pathseps_platform(&local_10d0);
  pcVar2 = local_10d0.c_str;
  iVar3 = stat(local_10d0.c_str,&local_10b8);
  if (pcVar2 != (char *)0x0 && local_10d0.owns_memory != 0) {
    free(pcVar2);
  }
  return (int)(iVar3 == 0 && (local_10b8.st_mode & 0xf000) == 0x4000);
}

Assistant:

int mctools_is_dir( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace( rawpath );
#ifdef MC_IS_WINDOWS
    mcwinstr wpath = mc_path2wpath( &path );
    DWORD fa = GetFileAttributesW( wpath.c_str );
    mc_winstr_dealloc( &wpath );
    if ( fa == INVALID_FILE_ATTRIBUTES )
      return 0;
    return ( fa & FILE_ATTRIBUTE_DIRECTORY) ? 1 : 0;
#else
    char buf[4096];
    mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_assign( &native, &path );
    mctools_pathseps_platform( &native );
    struct stat sinfo;
    int res = ( stat( native.c_str, &sinfo) == 0
                && S_ISDIR(sinfo.st_mode) ) ? 1 : 0;
    mcu8str_dealloc(&native);
    return res;
#endif
  }